

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmLinkImplementation * __thiscall
cmGeneratorTarget::GetLinkImplementation
          (cmGeneratorTarget *this,string *config,LinkInterfaceFor implFor,bool secondPass)

{
  bool bVar1;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  cmLinkImplementation *impl;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> local_f8;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> local_d8;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_c0;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_a8;
  bool local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  undefined4 local_38;
  
  bVar1 = cmTarget::CanCompileSources(this->Target);
  if (bVar1) {
    if (implFor == Usage) {
      this_00 = &GetHeadToLinkImplementationUsageRequirementsMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    else {
      this_00 = &GetHeadToLinkImplementationMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    impl = &std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
            ::operator[](this_00,(key_type *)&local_d8)->super_cmLinkImplementation;
    if (secondPass) {
      memset(&local_d8,0,0xa8);
      local_70._M_bucket_count = 1;
      local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_70._M_element_count = 0;
      local_70._M_rehash_policy._M_max_load_factor = 1.0;
      local_70._M_rehash_policy._M_next_resize = 0;
      local_70._M_single_bucket = (__node_base_ptr)0x0;
      local_38 = 0;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start =
           (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
           super_cmLinkImplementationLibraries).Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
           super_cmLinkImplementationLibraries).Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
           super_cmLinkImplementationLibraries).Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).Libraries.
      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_start;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).Libraries.
      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).Libraries.
      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70._M_buckets = &local_70._M_single_bucket;
      std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector(&local_f8);
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
                    super_cmLinkImplementationLibraries).Objects.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
                    super_cmLinkImplementationLibraries).Objects.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
                    super_cmLinkImplementationLibraries).Objects.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).Objects.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_start = local_c0.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).Objects.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_c0.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).Objects.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_c0.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_c0.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c0.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c0.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&local_f8);
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
                    super_cmLinkImplementationLibraries).WrongConfigLibraries.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
                    super_cmLinkImplementationLibraries).WrongConfigLibraries.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
                    super_cmLinkImplementationLibraries).WrongConfigLibraries.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).WrongConfigLibraries.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_start = local_a8.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).WrongConfigLibraries.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_a8.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).WrongConfigLibraries.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_a8.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_a8.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&local_f8);
      (((cmLinkImplementation *)&impl->super_cmLinkImplementationLibraries)->
      super_cmLinkImplementationLibraries).HadContextSensitiveCondition = local_90;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(impl->Languages).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(impl->Languages).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_f8.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(impl->Languages).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (impl->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (impl->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (impl->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(&(impl->LanguageRuntimeLibraries)._M_h,&local_70);
      impl->HadLinkLanguageSensitiveCondition = local_38._0_1_;
      *(undefined2 *)&impl->field_0xa1 = local_38._1_2_;
      impl->field_0xa3 = local_38._3_1_;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_a8);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_c0);
      std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector(&local_d8);
    }
    if (impl->field_0xa1 == '\0') {
      impl->field_0xa1 = 1;
      ComputeLinkImplementationLibraries
                (this,config,(cmOptionalLinkImplementation *)impl,this,implFor);
    }
    if (impl->field_0xa2 == '\0') {
      impl->field_0xa2 = 1;
      ComputeLinkImplementationLanguages(this,config,(cmOptionalLinkImplementation *)impl);
      ComputeLinkImplementationRuntimeLibraries(this,config,(cmOptionalLinkImplementation *)impl);
    }
  }
  else {
    impl = (cmLinkImplementation *)0x0;
  }
  return impl;
}

Assistant:

const cmLinkImplementation* cmGeneratorTarget::GetLinkImplementation(
  const std::string& config, LinkInterfaceFor implFor, bool secondPass) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    return nullptr;
  }

  HeadToLinkImplementationMap& hm =
    (implFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkImplementationUsageRequirementsMap(config)
       : this->GetHeadToLinkImplementationMap(config));
  cmOptionalLinkImplementation& impl = hm[this];
  if (secondPass) {
    impl = cmOptionalLinkImplementation();
  }
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, this, implFor);
  }
  if (!impl.LanguagesDone) {
    impl.LanguagesDone = true;
    this->ComputeLinkImplementationLanguages(config, impl);
    this->ComputeLinkImplementationRuntimeLibraries(config, impl);
  }
  return &impl;
}